

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Preprocessor::expectTimeScaleSpecifier
          (Preprocessor *this,Token *token,TimeScaleValue *value)

{
  double dVar1;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  string_view timeSuffix;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  bool bVar2;
  const_pointer pvVar3;
  size_type sVar4;
  TimeScaleValue *pTVar5;
  TimeScaleValue *in_RDX;
  Token *in_RSI;
  undefined8 in_RDI;
  Token TVar6;
  optional<slang::TimeScaleValue> checked;
  string_view text;
  const_pointer end;
  const_pointer start;
  optional<slang::TimeUnit> unit;
  size_t lengthConsumed;
  Token suffix;
  Token *in_stack_fffffffffffffe10;
  TimeUnit unit_00;
  undefined4 in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  TokenKind in_stack_fffffffffffffe1e;
  uint in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  SourceLocation in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar7;
  DiagCode in_stack_fffffffffffffe34;
  DiagCode code;
  char *in_stack_fffffffffffffe38;
  Token *in_stack_fffffffffffffe58;
  size_type in_stack_fffffffffffffe60;
  undefined1 outOfRange;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 uVar8;
  TokenKind kind;
  undefined1 in_stack_fffffffffffffe78 [16];
  NumericTokenFlags local_174 [2];
  _Optional_payload_base<slang::TimeUnit> timeUnit;
  SourceLocation in_stack_fffffffffffffe90;
  undefined8 uVar9;
  undefined6 in_stack_fffffffffffffe98;
  TokenKind in_stack_fffffffffffffe9e;
  undefined2 in_stack_fffffffffffffea0;
  undefined2 in_stack_fffffffffffffea2;
  undefined4 in_stack_fffffffffffffea4;
  string_view in_stack_fffffffffffffeb0;
  undefined8 local_110;
  Info *local_108;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  string_view local_f0;
  string_view local_e0;
  const_pointer local_d0;
  string_view local_c8;
  const_pointer local_b8;
  Token local_b0;
  SourceRange local_a0;
  undefined4 local_8c;
  string_view local_88;
  string_view local_78;
  _Optional_payload_base<slang::TimeUnit> local_62;
  size_type local_60;
  SourceRange local_58;
  undefined4 local_44;
  Token local_40;
  Token local_30;
  TimeScaleValue *local_20;
  Token *local_18;
  
  kind = (TokenKind)((ulong)in_RDI >> 0x30);
  timeUnit = SUB32((uint3)stack0xfffffffffffffe8d >> 8,0);
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = peek((Preprocessor *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe1e);
  if (bVar2) {
    TVar6 = consume((Preprocessor *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    local_30._0_8_ = TVar6._0_8_;
    local_18->kind = local_30.kind;
    local_18->field_0x2 = local_30._2_1_;
    local_18->numFlags = (NumericTokenFlags)local_30.numFlags.raw;
    local_18->rawLen = local_30.rawLen;
    local_30.info = TVar6.info;
    local_18->info = local_30.info;
    local_30 = TVar6;
    local_40 = peek((Preprocessor *)
                    CONCAT26(in_stack_fffffffffffffe1e,
                             CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)));
    if ((local_40.kind != Identifier) ||
       (bVar2 = Token::isOnSameLine(in_stack_fffffffffffffe58), !bVar2)) {
      local_44 = 0xa0004;
      local_58 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                             );
      range.startLoc._4_4_ = in_stack_fffffffffffffe24;
      range.startLoc._0_4_ = in_stack_fffffffffffffe20;
      range.endLoc = in_stack_fffffffffffffe28;
      addDiag((Preprocessor *)
              CONCAT26(in_stack_fffffffffffffe1e,
                       CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
              in_stack_fffffffffffffe34,range);
      return false;
    }
    local_78 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                             );
    timeSuffix._M_len._4_4_ = in_stack_fffffffffffffe34;
    timeSuffix._M_len._0_4_ = in_stack_fffffffffffffe30;
    timeSuffix._M_str = in_stack_fffffffffffffe38;
    local_62 = (_Optional_payload_base<slang::TimeUnit>)
               suffixToTimeUnit(timeSuffix,(size_t *)in_stack_fffffffffffffe28);
    bVar2 = std::optional::operator_cast_to_bool((optional<slang::TimeUnit> *)0x369015);
    uVar8 = true;
    if (bVar2) {
      local_88 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffe24,
                                                  in_stack_fffffffffffffe20));
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_88);
      uVar8 = local_60 != sVar4;
      in_stack_fffffffffffffe60 = local_60;
    }
    outOfRange = (undefined1)(in_stack_fffffffffffffe60 >> 0x38);
    if ((bool)uVar8 != false) {
      local_8c = 0xa0004;
      local_a0 = Token::range((Token *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)
                             );
      range_00.startLoc._4_4_ = in_stack_fffffffffffffe24;
      range_00.startLoc._0_4_ = in_stack_fffffffffffffe20;
      range_00.endLoc = in_stack_fffffffffffffe28;
      addDiag((Preprocessor *)
              CONCAT26(in_stack_fffffffffffffe1e,
                       CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
              in_stack_fffffffffffffe34,range_00);
      return false;
    }
    local_b0 = consume((Preprocessor *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                      );
    local_c8 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                             );
    local_b8 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_c8);
    local_e0 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                             );
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_e0);
    local_f0 = Token::rawText((Token *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20)
                             );
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_f0);
    local_d0 = pvVar3 + sVar4;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_100,local_b8,(long)local_d0 - (long)local_b8);
    Token::trivia((Token *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    Token::location(local_18);
    Token::intValue((Token *)CONCAT26(in_stack_fffffffffffffe1e,
                                      CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
                   );
    SVInt::toDouble((SVInt *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    in_stack_fffffffffffffe20 = (uint)(ushort)local_62;
    in_stack_fffffffffffffe18 = 0;
    trivia._M_ptr._6_2_ = in_stack_fffffffffffffe9e;
    trivia._M_ptr._0_6_ = in_stack_fffffffffffffe98;
    trivia._M_extent._M_extent_value._0_2_ = in_stack_fffffffffffffea0;
    trivia._M_extent._M_extent_value._2_2_ = local_62;
    trivia._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffffea4;
    Token::Token(in_stack_fffffffffffffe78._8_8_,in_stack_fffffffffffffe78._0_8_,kind,trivia,
                 in_stack_fffffffffffffeb0,in_stack_fffffffffffffe90,
                 (double)CONCAT17(uVar8,in_stack_fffffffffffffe68),(bool)outOfRange,
                 (optional<slang::TimeUnit>)timeUnit);
    local_18->kind = (undefined2)local_110;
    local_18->field_0x2 = local_110._2_1_;
    local_18->numFlags = (NumericTokenFlags)local_110._3_1_;
    local_18->rawLen = local_110._4_4_;
    local_18->info = local_108;
    SVInt::~SVInt((SVInt *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    in_stack_fffffffffffffe10 = (Token *)local_100._M_str;
  }
  else {
    TVar6 = expect((Preprocessor *)
                   CONCAT44(in_stack_fffffffffffffea4,
                            CONCAT22(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0)),
                   in_stack_fffffffffffffe9e);
    uVar9 = TVar6._0_8_;
    local_18->kind = (short)uVar9;
    local_18->field_0x2 = (char)((ulong)uVar9 >> 0x10);
    local_18->numFlags = (NumericTokenFlags)(char)((ulong)uVar9 >> 0x18);
    local_18->rawLen = (int)((ulong)uVar9 >> 0x20);
    local_18->info = TVar6.info;
    bVar2 = Token::isMissing(local_18);
    if (bVar2) {
      return false;
    }
  }
  dVar1 = Token::realValue(in_stack_fffffffffffffe10);
  unit_00 = (TimeUnit)((ulong)in_stack_fffffffffffffe10 >> 0x38);
  uVar7 = SUB84(dVar1,0);
  code = SUB84((ulong)dVar1 >> 0x20,0);
  local_174[0] = Token::numericFlags(local_18);
  NumericTokenFlags::unit(local_174);
  register0x00000000 =
       (_Optional_payload_base<slang::TimeScaleValue>)
       TimeScaleValue::fromLiteral
                 ((double)CONCAT26(in_stack_fffffffffffffe1e,
                                   CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),
                  unit_00);
  bVar2 = std::optional::operator_cast_to_bool((optional<slang::TimeScaleValue> *)0x3693a7);
  if (bVar2) {
    pTVar5 = std::optional<slang::TimeScaleValue>::operator*
                       ((optional<slang::TimeScaleValue> *)0x369401);
    *local_20 = *pTVar5;
  }
  else {
    Token::range((Token *)CONCAT44(code,uVar7));
    range_01.startLoc._4_4_ = in_stack_fffffffffffffe24;
    range_01.startLoc._0_4_ = in_stack_fffffffffffffe20;
    range_01.endLoc = in_stack_fffffffffffffe28;
    addDiag((Preprocessor *)
            CONCAT26(in_stack_fffffffffffffe1e,
                     CONCAT24(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18)),code,range_01);
  }
  return bVar2;
}

Assistant:

bool Preprocessor::expectTimeScaleSpecifier(Token& token, TimeScaleValue& value) {
    if (peek(TokenKind::IntegerLiteral)) {
        // We wanted to see a time literal here, but for directives we will allow there
        // to be a space between the integer and suffix portions of the time.
        token = consume();

        auto suffix = peek();
        if (suffix.kind != TokenKind::Identifier || !suffix.isOnSameLine()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        size_t lengthConsumed;
        auto unit = suffixToTimeUnit(suffix.rawText(), lengthConsumed);
        if (!unit || lengthConsumed != suffix.rawText().length()) {
            addDiag(diag::ExpectedTimeLiteral, token.range());
            return false;
        }

        // Glue the tokens together to form a "time literal"
        consume();
        auto start = token.rawText().data();
        auto end = suffix.rawText().data() + suffix.rawText().size();
        auto text = std::string_view(start, size_t(end - start));

        token = Token(alloc, TokenKind::TimeLiteral, token.trivia(), text, token.location(),
                      token.intValue().toDouble(), false, unit);
    }
    else {
        token = expect(TokenKind::TimeLiteral);
        if (token.isMissing())
            return false;
    }

    auto checked = TimeScaleValue::fromLiteral(token.realValue(), token.numericFlags().unit());
    if (!checked) {
        addDiag(diag::InvalidTimeScaleSpecifier, token.range());
        return false;
    }

    value = *checked;
    return true;
}